

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinedH264Demuxer.cpp
# Opt level: O0

void __thiscall CombinedH264Demuxer::openFile(CombinedH264Demuxer *this,string *streamName)

{
  AbstractReader *pAVar1;
  uint uVar2;
  undefined8 uVar3;
  ostream *poVar4;
  VodCoreException *this_00;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream ss;
  string *streamName_local;
  CombinedH264Demuxer *this_local;
  
  readClose(this);
  pAVar1 = this->m_bufferedReader;
  uVar2 = this->m_readerID;
  uVar3 = std::__cxx11::string::c_str();
  uVar2 = (*pAVar1->_vptr_AbstractReader[8])(pAVar1,(ulong)uVar2,uVar3,0,0);
  if ((uVar2 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    poVar4 = std::operator<<((ostream *)local_190,"Can\'t open stream ");
    std::operator<<(poVar4,(string *)streamName);
    this_00 = (VodCoreException *)__cxa_allocate_exception(0x28);
    std::__cxx11::ostringstream::str();
    VodCoreException::VodCoreException(this_00,100,&local_1c0);
    __cxa_throw(this_00,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  this->m_dataProcessed = 0;
  return;
}

Assistant:

void CombinedH264Demuxer::openFile(const std::string& streamName)
{
    readClose();

    if (!m_bufferedReader->openStream(m_readerID, streamName.c_str()))
        THROW(ERR_FILE_NOT_FOUND, "Can't open stream " << streamName)

    m_dataProcessed = 0;
}